

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O1

void __thiscall CharScanner::match(CharScanner *this,BitSet *b)

{
  bool bVar1;
  int iVar2;
  ScannerException *this_00;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar2 = (*(this->super_TokenStream)._vptr_TokenStream[0x12])(this,1);
  bVar1 = BitSet::member(b,iVar2);
  if (!bVar1) {
    this_00 = (ScannerException *)__cxa_allocate_exception(0x38);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"mismatched char: \'","");
    iVar2 = (*(this->super_TokenStream)._vptr_TokenStream[0x12])(this,1);
    if (iVar2 != -1) {
      charName::buf[0] = (char)iVar2;
      charName::buf[1] = '\0';
    }
    plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
    local_90 = (long *)*plVar3;
    plVar4 = plVar3 + 2;
    if (local_90 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70._M_dataplus._M_p = (pointer)*plVar3;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar5) {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70.field_2._8_8_ = plVar3[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar5;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ScannerException::ScannerException(this_00,&local_70,((this->inputState).ref)->ptr->line);
    __cxa_throw(this_00,&ScannerException::typeinfo,ANTLRException::~ANTLRException);
  }
  (*(this->super_TokenStream)._vptr_TokenStream[6])(this);
  return;
}

Assistant:

void CharScanner::match(const BitSet& b)
{
	if (!b.member(LA(1))) {
		throw ScannerException(std::string("mismatched char: '") + charName(LA(1)) + "'", inputState->line);
	}
	consume();
}